

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getNumberOfLinesRange
          (LineRenderCase *this,int queryAreaBegin,int queryAreaEnd,float patternStart,
          float patternSize,int viewportArea,QueryDirection queryDir)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int in_R9D;
  float fVar7;
  float fVar8;
  
  lVar4 = CONCAT44(in_register_00000034,queryAreaBegin);
  bVar1 = *(byte *)(lVar4 + 0x80 + (ulong)(in_R9D == 0));
  uVar5 = (uint)bVar1;
  if ((*(byte *)(lVar4 + 0xd8) & 1) == 0) {
    fVar7 = 1.0;
  }
  else {
    fVar7 = (float)*(int *)(lVar4 + 0xdc);
  }
  iVar2 = 0;
  iVar3 = 0;
  for (; (int)uVar5 < (int)(*(int *)(lVar4 + 0xd4) + (uint)bVar1); uVar5 = uVar5 + 1) {
    fVar8 = ((((float)(int)uVar5 / (float)*(int *)(lVar4 + 0xd4)) * patternSize + patternStart) *
             0.5 + 0.5) * (float)(int)queryDir;
    if ((fVar8 <= (float)queryAreaEnd + 1.0) || ((float)viewportArea + -1.0 <= fVar8)) {
      uVar6 = -(uint)(fVar8 < fVar7 * 0.5 + (float)viewportArea + 1.0 &&
                     ((float)queryAreaEnd - fVar7 * 0.5) + -1.0 < fVar8) & 1;
    }
    else {
      iVar3 = iVar3 + 1;
      uVar6 = 1;
    }
    iVar2 = iVar2 + uVar6;
  }
  *(int *)&(this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = iVar3;
  *(int *)((long)&(this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode + 4) = iVar2;
  return (IVec2)(int  [2])this;
}

Assistant:

tcu::IVec2 LineRenderCase::getNumberOfLinesRange (int queryAreaBegin, int queryAreaEnd, float patternStart, float patternSize, int viewportArea, QueryDirection queryDir) const
{
	// pattern is not symmetric due to mirroring
	const int	patternStartNdx	= (queryDir == DIRECTION_HORIZONTAL) ? ((m_hasGeometryStage) ? (1) : (0)) : ((m_hasTessellationStage) ? (1) : (0));
	const int	patternEndNdx	= patternStartNdx + m_patternSide;

	int			numLinesMin		= 0;
	int			numLinesMax		= 0;

	for (int lineNdx = patternStartNdx; lineNdx < patternEndNdx; ++lineNdx)
	{
		const float linePos		= (patternStart + (float(lineNdx) / float(m_patternSide)) * patternSize) * 0.5f + 0.5f;
		const float lineWidth	= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);

		if (linePos * (float)viewportArea > (float)queryAreaBegin + 1.0f &&
			linePos * (float)viewportArea < (float)queryAreaEnd   - 1.0f)
		{
			// line center is within the area
			++numLinesMin;
			++numLinesMax;
		}
		else if (linePos * (float)viewportArea > (float)queryAreaBegin - lineWidth*0.5f - 1.0f &&
		         linePos * (float)viewportArea < (float)queryAreaEnd   + lineWidth*0.5f + 1.0f)
		{
			// line could leak into area
			++numLinesMax;
		}
	}

	return tcu::IVec2(numLinesMin, numLinesMax);
}